

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScriptContext.cpp
# Opt level: O2

BOOL __thiscall Js::ScriptContext::CheckObject(ScriptContext *this,Var object)

{
  bool bVar1;
  Var local_10;
  Var object_local;
  
  local_10 = object;
  bVar1 = JsUtil::ReadOnlyList<void_*,_Memory::ArenaAllocator,_DefaultComparer>::Contains
                    ((ReadOnlyList<void_*,_Memory::ArenaAllocator,_DefaultComparer> *)
                     this->operationStack,&local_10);
  return (BOOL)bVar1;
}

Assistant:

BOOL ScriptContext::CheckObject(Var object)
    {
        return operationStack->Contains(object);
    }